

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::Scene::readFrom(Scene *this,BinaryReader *binary)

{
  vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_> *in_RDI;
  BinaryReader *unaff_retaddr;
  
  BinaryReader::read<pbrt::Film>((BinaryReader *)this,(shared_ptr<pbrt::Film> *)binary);
  BinaryReader::
  read<std::shared_ptr<pbrt::Camera>,std::allocator<std::shared_ptr<pbrt::Camera>>,void,void>
            (unaff_retaddr,in_RDI);
  BinaryReader::read<pbrt::Object>((BinaryReader *)this,(shared_ptr<pbrt::Object> *)binary);
  return;
}

Assistant:

void Scene::readFrom(BinaryReader &binary) 
  {
    binary.read(film);
    binary.read(cameras);
    binary.read(world);
  }